

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O1

pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *
__thiscall
anurbs::NurbsSurfaceGeometry<2L>::shape_functions_at
          (pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
           *__return_storage_ptr__,NurbsSurfaceGeometry<2L> *this,double u,double v,Index order)

{
  double *pdVar1;
  long lVar2;
  bool bVar3;
  pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *ppVar4;
  Index IVar5;
  Index IVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar9;
  long lVar10;
  vector<long,_std::allocator<long>_> indices;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> weights;
  NurbsSurfaceShapeFunction shape_function;
  long local_2d8;
  pointer local_2d0;
  vector<long,_std::allocator<long>_> local_2c8;
  pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  *local_2b0;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_2a8;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_268;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_240;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_218;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_1f0;
  NurbsSurfaceShapeFunction local_1c8;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_78;
  
  local_2b0 = __return_storage_ptr__;
  iVar7 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  iVar8 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  NurbsSurfaceShapeFunction::NurbsSurfaceShapeFunction
            (&local_1c8,CONCAT44(extraout_var,iVar7),CONCAT44(extraout_var_00,iVar8),order);
  if ((this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows == 0) {
    knots_u(&local_240,this);
    knots_v(&local_268,this);
    NurbsSurfaceShapeFunction::compute(&local_1c8,&local_240,&local_268,u,v);
    free(local_268.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
         .m_data);
    local_1f0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = local_240.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
  }
  else {
    pdVar1 = (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar9 = (this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    iVar7 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
    lVar10 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    iVar8 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
    local_2a8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = (lVar9 - CONCAT44(extraout_var_01,iVar7)) + 1;
    local_2a8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = (lVar10 - CONCAT44(extraout_var_02,iVar8)) + 1;
    local_2a8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = pdVar1;
    if ((pdVar1 != (double *)0x0) &&
       ((local_2a8.
         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         .
         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_cols.m_value |
        local_2a8.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value) < 0)) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<double, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<const Eigen::Matrix<double, -1, -1>>, Level = 0]"
                   );
    }
    knots_u(&local_1f0,this);
    knots_v(&local_218,this);
    local_78.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = 0;
    local_78.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = 0;
    local_78.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)0x0;
    local_78.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = 0;
    local_78.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    local_78.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_rows = 0;
    local_78.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_cols = 0;
    Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>>::
    construct<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>const>
              ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>>
                *)&local_78,
               (Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
               &local_2a8);
    NurbsSurfaceShapeFunction::compute(&local_1c8,&local_1f0,&local_218,&local_78,u,v);
    free(local_78.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
         m_storage.m_data);
    free(local_218.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
         .m_data);
  }
  free(local_1f0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_2c8,(local_1c8.m_shape_v.m_degree + 1) * (local_1c8.m_shape_u.m_degree + 1),
             (allocator_type *)&local_2a8);
  if (-1 < local_1c8.m_shape_u.m_degree) {
    local_2d0 = local_2c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_2d8 = 0;
    do {
      if (-1 < local_1c8.m_shape_v.m_degree) {
        lVar10 = 0;
        lVar9 = 0;
        do {
          IVar6 = local_1c8.m_first_nonzero_pole_v;
          IVar5 = local_1c8.m_first_nonzero_pole_u;
          (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
          lVar2 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          iVar7 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
          local_2d0[lVar9] =
               IVar6 + lVar9 + (IVar5 + local_2d8) * ((lVar2 - CONCAT44(extraout_var_03,iVar7)) + 1)
          ;
          lVar10 = lVar10 + 8;
          bVar3 = lVar9 < local_1c8.m_shape_v.m_degree;
          lVar9 = lVar9 + 1;
        } while (bVar3);
        local_2d0 = (pointer)((long)local_2d0 + lVar10);
      }
      bVar3 = local_2d8 < local_1c8.m_shape_u.m_degree;
      local_2d8 = local_2d8 + 1;
    } while (bVar3);
  }
  NurbsSurfaceShapeFunction::values(&local_2a8,&local_1c8);
  ppVar4 = local_2b0;
  std::pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::
  pair<std::vector<long,_std::allocator<long>_>_&,_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_true>
            (local_2b0,&local_2c8,&local_2a8);
  free(local_2a8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
       .m_data);
  if (local_2c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_1c8.m_values.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
       .m_data);
  free(local_1c8.m_weighted_sums.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_v.m_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_v.m_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_v.m_ndu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_v.m_right.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_v.m_left.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_v.m_values.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
       .m_storage.m_data);
  free(local_1c8.m_shape_u.m_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_u.m_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_u.m_ndu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_u.m_right.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_u.m_left.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_1c8.m_shape_u.m_values.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
       .m_storage.m_data);
  return ppVar4;
}

Assistant:

std::pair<std::vector<Index>, Eigen::MatrixXd>
    shape_functions_at(const double u, const double v, const Index order) const
    {
        NurbsSurfaceShapeFunction shape_function(degree_u(), degree_v(), order);

        if (is_rational()) {
            Eigen::Map<const Eigen::MatrixXd> weights(m_weights.data(), nb_poles_u(), nb_poles_v());
            shape_function.compute(knots_u(), knots_v(), weights, u, v);
        } else {
            shape_function.compute(knots_u(), knots_v(), u, v);
        }

        std::vector<Index> indices(shape_function.nb_nonzero_poles());
        auto it = indices.begin();

        for (Index i = 0; i < shape_function.nb_nonzero_poles_u(); i++) {
            for (Index j = 0; j < shape_function.nb_nonzero_poles_v(); j++) {
                const Index pole_u = shape_function.first_nonzero_pole_u() + i;
                const Index pole_v = shape_function.first_nonzero_pole_v() + j;

                Index poleIndex = Math::single_index(nb_poles_u(), nb_poles_v(), pole_u, pole_v);

                *(it++) = poleIndex;
            }
        }

        return {indices, shape_function.values()};
    }